

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

void __thiscall argparse::ArgumentParser::ArgumentParser(ArgumentParser *this,string *aProgramName)

{
  _Rb_tree_header *p_Var1;
  Argument *this_00;
  allocator<char> local_69;
  any local_68;
  any local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string(&this->mProgramName,aProgramName);
  (this->mPositionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mPositionalArguments;
  (this->mPositionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mPositionalArguments;
  (this->mPositionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node._M_size
       = 0;
  (this->mOptionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mOptionalArguments;
  (this->mOptionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mOptionalArguments;
  (this->mOptionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node._M_size
       = 0;
  p_Var1 = &(this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = add_argument<char_const*,char_const*>(this,"-h","--help");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"show this help message and exit",&local_69);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this_00->mHelp,&local_48);
  this_00->mNumArgs = 0;
  local_58._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_58._M_storage._M_ptr = (void *)0x0;
  std::any::operator=(&this_00->mDefaultValue,&local_58);
  local_68._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_68._M_storage = (_Storage)0x1;
  Argument::implicit_value(this_00,&local_68);
  std::any::reset(&local_68);
  std::any::reset(&local_58);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

explicit ArgumentParser(std::string aProgramName = {})
      : mProgramName(std::move(aProgramName)) {
    add_argument(Argument::mHelpOption, Argument::mHelpOptionLong)
        .help("show this help message and exit")
        .nargs(0)
        .default_value(false)
        .implicit_value(true);
  }